

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_publish(Curl_easy *data)

{
  int iVar1;
  char *len;
  long lVar2;
  curl_off_t postfieldsize;
  size_t sStack_60;
  char encodedbytes [4];
  size_t encodelen;
  size_t remaininglength;
  size_t i;
  uchar *pkt;
  size_t topiclen;
  char *topic;
  size_t payloadlen;
  char *payload;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  payloadlen = (size_t)(data->set).postfields;
  topiclen = 0;
  i = 0;
  topic = (char *)(data->set).postfieldsize;
  if ((char *)payloadlen == (char *)0x0) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pCStack_18 = data;
    if ((long)topic < 0) {
      topic = (char *)strlen((char *)payloadlen);
    }
    payload._4_4_ = mqtt_get_topic(pCStack_18,(char **)&topiclen,(size_t *)&pkt);
    if (payload._4_4_ == CURLE_OK) {
      len = topic + 2 + (long)pkt;
      iVar1 = mqtt_encode_len((char *)((long)&postfieldsize + 4),(size_t)len);
      sStack_60 = (size_t)iVar1;
      i = (size_t)(*Curl_cmalloc)((size_t)(len + sStack_60 + 1));
      if ((char *)i == (char *)0x0) {
        payload._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        *(char *)i = '0';
        memcpy((char *)(i + 1),(void *)((long)&postfieldsize + 4),sStack_60);
        *(char *)(i + sStack_60 + 1) = (char)((ulong)pkt >> 8);
        lVar2 = sStack_60 + 3;
        *(char *)(i + sStack_60 + 2) = (char)pkt;
        memcpy((char *)(i + lVar2),(void *)topiclen,(size_t)pkt);
        memcpy((char *)(i + (long)(pkt + lVar2)),(void *)payloadlen,(size_t)topic);
        payload._4_4_ = mqtt_send(pCStack_18,(char *)i,(size_t)(topic + (long)(pkt + lVar2)));
      }
    }
    (*Curl_cfree)((void *)i);
    (*Curl_cfree)((void *)topiclen);
    data_local._4_4_ = payload._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode mqtt_publish(struct Curl_easy *data)
{
  CURLcode result;
  char *payload = data->set.postfields;
  size_t payloadlen;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *pkt = NULL;
  size_t i = 0;
  size_t remaininglength;
  size_t encodelen;
  char encodedbytes[4];
  curl_off_t postfieldsize = data->set.postfieldsize;

  if(!payload) {
    DEBUGF(infof(data, "mqtt_publish without payload, return bad arg"));
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if(postfieldsize < 0)
    payloadlen = strlen(payload);
  else
    payloadlen = (size_t)postfieldsize;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  remaininglength = payloadlen + 2 + topiclen;
  encodelen = mqtt_encode_len(encodedbytes, remaininglength);

  /* add the control byte and the encoded remaining length */
  pkt = malloc(remaininglength + 1 + encodelen);
  if(!pkt) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  /* assemble packet */
  pkt[i++] = MQTT_MSG_PUBLISH;
  memcpy(&pkt[i], encodedbytes, encodelen);
  i += encodelen;
  pkt[i++] = (topiclen >> 8) & 0xff;
  pkt[i++] = (topiclen & 0xff);
  memcpy(&pkt[i], topic, topiclen);
  i += topiclen;
  memcpy(&pkt[i], payload, payloadlen);
  i += payloadlen;
  result = mqtt_send(data, (char *)pkt, i);

fail:
  free(pkt);
  free(topic);
  return result;
}